

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

vec3 closest_point_point_triangle(vec3 p,vec3 a,vec3 b,vec3 c,triangle_contact_type_t *type)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  vec3 vVar8;
  vec3 vVar9;
  vec3 vVar10;
  undefined8 local_518;
  undefined4 local_510;
  float w;
  float v;
  float denom;
  undefined4 local_438;
  float w_2;
  float va;
  undefined4 local_390;
  float w_1;
  float vb;
  float d6;
  float d5;
  vec3 cp;
  float fStack_29c;
  undefined4 local_298;
  float v_1;
  float vc;
  float d4;
  float d3;
  vec3 bp;
  float d2;
  float d1;
  vec3 ap;
  vec3 ac;
  vec3 ab;
  triangle_contact_type_t *type_local;
  vec3 c_local;
  vec3 b_local;
  vec3 a_local;
  vec3 p_local;
  undefined4 local_c;
  
  local_c = c.z;
  p_local._4_8_ = c._0_8_;
  vVar8 = vec3_subtract(b,a);
  vVar9 = vec3_subtract(c,a);
  vVar10 = vec3_subtract(p,a);
  fVar1 = vec3_dot(vVar8,vVar10);
  fVar2 = vec3_dot(vVar9,vVar10);
  if ((0.0 < fVar1) || (0.0 < fVar2)) {
    vVar10 = vec3_subtract(p,b);
    fVar3 = vec3_dot(vVar8,vVar10);
    fVar4 = vec3_dot(vVar9,vVar10);
    if ((fVar3 < 0.0) || (fVar3 < fVar4)) {
      fVar5 = fVar1 * fVar4 + -(fVar3 * fVar2);
      if (((0.0 < fVar5) || (fVar1 < 0.0)) || (0.0 < fVar3)) {
        vVar10 = vec3_subtract(p,c);
        fVar6 = vec3_dot(vVar8,vVar10);
        fVar7 = vec3_dot(vVar9,vVar10);
        if ((fVar7 < 0.0) || (fVar7 < fVar6)) {
          fVar1 = fVar6 * fVar2 + -(fVar1 * fVar7);
          if ((0.0 < fVar1) || ((fVar2 < 0.0 || (0.0 < fVar7)))) {
            fVar2 = fVar3 * fVar7 + -(fVar6 * fVar4);
            if ((0.0 < fVar2) || ((fVar4 - fVar3 < 0.0 || (fVar6 - fVar7 < 0.0)))) {
              *type = TRIANGLE_CONTACT_FACE;
              fVar2 = 1.0 / (fVar2 + fVar1 + fVar5);
              vVar8 = vec3_scale(vVar8,fVar1 * fVar2);
              vVar8 = vec3_add(a,vVar8);
              vVar9 = vec3_scale(vVar9,fVar5 * fVar2);
              vVar8 = vec3_add(vVar8,vVar9);
              local_518 = vVar8._0_8_;
              p_local.y = (float)local_518;
              p_local.z = local_518._4_4_;
              local_510 = vVar8.z;
              local_c = local_510;
            }
            else {
              *type = TRIANGLE_CONTACT_BC;
              vVar8 = vec3_subtract(c,b);
              vVar8 = vec3_scale(vVar8,(fVar4 - fVar3) / ((fVar4 - fVar3) + (fVar6 - fVar7)));
              vVar8 = vec3_add(b,vVar8);
              _v = vVar8._0_8_;
              p_local.y = v;
              p_local.z = denom;
              local_438 = vVar8.z;
              local_c = local_438;
            }
          }
          else {
            *type = TRIANGLE_CONTACT_AC;
            vVar8 = vec3_scale(vVar9,fVar2 / (fVar2 - fVar7));
            vVar8 = vec3_add(a,vVar8);
            _w_2 = vVar8._0_8_;
            p_local.y = w_2;
            p_local.z = va;
            local_390 = vVar8.z;
            local_c = local_390;
          }
        }
        else {
          *type = TRIANGLE_CONTACT_C;
        }
      }
      else {
        *type = TRIANGLE_CONTACT_AB;
        vVar8 = vec3_scale(vVar8,fVar1 / (fVar1 - fVar3));
        vVar8 = vec3_add(a,vVar8);
        stack0xfffffffffffffd60 = vVar8._0_8_;
        p_local.y = cp.z;
        p_local.z = fStack_29c;
        local_298 = vVar8.z;
        local_c = local_298;
      }
    }
    else {
      *type = TRIANGLE_CONTACT_B;
      p_local._4_8_ = b._0_8_;
      local_c = b.z;
    }
  }
  else {
    *type = TRIANGLE_CONTACT_A;
    p_local._4_8_ = a._0_8_;
    local_c = a.z;
  }
  vVar8.z = local_c;
  vVar8.x = p_local.y;
  vVar8.y = p_local.z;
  return vVar8;
}

Assistant:

vec3 closest_point_point_triangle(vec3 p, vec3 a, vec3 b, vec3 c, triangle_contact_type_t *type) {
    vec3 ab = vec3_subtract(b, a);
    vec3 ac = vec3_subtract(c, a);
    vec3 ap = vec3_subtract(p, a);
    float d1 = vec3_dot(ab, ap);
    float d2 = vec3_dot(ac, ap);
    if (d1 <= 0.0f && d2 <= 0.0f) {
        *type = TRIANGLE_CONTACT_A;
        return a;
    }

    vec3 bp = vec3_subtract(p, b);
    float d3 = vec3_dot(ab, bp);
    float d4 = vec3_dot(ac, bp);
    if (d3 >= 0.0f && d4 <= d3) {
        *type = TRIANGLE_CONTACT_B;
        return b; 
    }

    float vc = d1*d4 - d3*d2;
    if (vc <= 0.0f && d1 >= 0.0f && d3 <= 0.0f) {
        *type = TRIANGLE_CONTACT_AB;
        float v = d1 / (d1 - d3);
        return vec3_add(a, vec3_scale(ab, v));
    }

    vec3 cp = vec3_subtract(p, c);
    float d5 = vec3_dot(ab, cp);
    float d6 = vec3_dot(ac, cp);
    if (d6 >= 0.0f && d5 <= d6) {
        *type = TRIANGLE_CONTACT_C;
        return c;
    }

    float vb = d5*d2 - d1*d6;
    if (vb <= 0.0f && d2 >= 0.0f && d6 <= 0.0f) {
        *type = TRIANGLE_CONTACT_AC;
        float w = d2 / (d2 - d6);
        return vec3_add(a, vec3_scale(ac, w));
    }

    float va = d3*d6 - d5*d4;
    if (va <= 0.0f && (d4 - d3) >= 0.0f && (d5 - d6) >= 0.0f) {
        *type = TRIANGLE_CONTACT_BC;
        float w = (d4 - d3) / ((d4 - d3) + (d5 - d6));
        return vec3_add(b, vec3_scale(vec3_subtract(c, b), w));
    }

    *type = TRIANGLE_CONTACT_FACE;
    float denom = 1.0f / (va + vb + vc);
    float v = vb * denom;
    float w = vc * denom;
    return vec3_add(vec3_add(a, vec3_scale(ab, v)), vec3_scale(ac, w));
}